

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

shared_ptr<Pipeline> __thiscall
anon_unknown.dwarf_34820f::ImageOptimizer::makePipeline
          (ImageOptimizer *this,string *description,Pipeline *next)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  element_type *peVar6;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  element_type *extraout_RAX_02;
  element_type *extraout_RAX_03;
  element_type *extraout_RAX_04;
  element_type *extraout_RAX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_09;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_15;
  double dVar8;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> _Var9;
  J_COLOR_SPACE cs;
  int components;
  string colorspace;
  uint local_11c;
  uint local_118;
  undefined1 local_111;
  QPDFObjectHandle h_obj;
  QPDFObjectHandle w_obj;
  QPDFObjectHandle dict;
  QPDFObjectHandle components_obj;
  QPDFObjectHandle colorspace_obj;
  Pipeline *next_local;
  Pl_DCT *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  _Any_data local_a8;
  element_type *local_98;
  code *local_90;
  _Any_data local_88;
  element_type *local_78;
  code *local_70;
  _Any_data local_68;
  element_type *local_58;
  code *local_50;
  _Any_data local_48;
  element_type *local_38;
  code *local_30;
  CompressConfig *local_28;
  
  (this->super_StreamDataProvider)._vptr_StreamDataProvider = (_func_int **)0x0;
  *(undefined8 *)&(this->super_StreamDataProvider).supports_retry = 0;
  QPDFObjectHandle::getDict(&dict);
  paVar1 = &colorspace.field_2;
  colorspace._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorspace,"/Width","");
  QPDFObjectHandle::getKey(&w_obj,(string *)&dict);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorspace._M_dataplus._M_p != paVar1) {
    operator_delete(colorspace._M_dataplus._M_p,
                    CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                             colorspace.field_2._M_local_buf[0]) + 1);
  }
  colorspace._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorspace,"/Height","");
  QPDFObjectHandle::getKey(&h_obj,(string *)&dict);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorspace._M_dataplus._M_p != paVar1) {
    operator_delete(colorspace._M_dataplus._M_p,
                    CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                             colorspace.field_2._M_local_buf[0]) + 1);
  }
  colorspace._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorspace,"/ColorSpace","");
  QPDFObjectHandle::getKey(&colorspace_obj,(string *)&dict);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorspace._M_dataplus._M_p != paVar1) {
    operator_delete(colorspace._M_dataplus._M_p,
                    CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                             colorspace.field_2._M_local_buf[0]) + 1);
  }
  bVar4 = QPDFObjectHandle::isNumber(&w_obj);
  peVar6 = (element_type *)CONCAT71(extraout_var,bVar4);
  _Var7._M_pi = extraout_RDX;
  if (bVar4) {
    bVar4 = QPDFObjectHandle::isNumber(&h_obj);
    peVar6 = (element_type *)CONCAT71(extraout_var_00,bVar4);
    _Var7._M_pi = extraout_RDX_00;
    if (bVar4) {
      colorspace._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&colorspace,"/BitsPerComponent","");
      QPDFObjectHandle::getKey(&components_obj,(string *)&dict);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)colorspace._M_dataplus._M_p != paVar1) {
        operator_delete(colorspace._M_dataplus._M_p,
                        CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                                 colorspace.field_2._M_local_buf[0]) + 1);
      }
      bVar4 = QPDFObjectHandle::isInteger(&components_obj);
      peVar6 = (element_type *)CONCAT71(extraout_var_01,bVar4);
      _Var7._M_pi = extraout_RDX_01;
      if ((bVar4) &&
         (peVar6 = (element_type *)QPDFObjectHandle::getIntValue(&components_obj),
         _Var7._M_pi = extraout_RDX_02, peVar6 == (element_type *)0x8)) {
        local_118 = 0;
        bVar4 = QPDFObjectHandle::isInteger(&w_obj);
        if (bVar4) {
          local_118 = QPDFObjectHandle::getUIntValueAsUInt(&w_obj);
        }
        else {
          dVar8 = QPDFObjectHandle::getNumericValue(&w_obj);
          local_118 = (uint)(long)dVar8;
        }
        local_11c = 0;
        bVar4 = QPDFObjectHandle::isInteger(&h_obj);
        if (bVar4) {
          local_11c = QPDFObjectHandle::getUIntValueAsUInt(&h_obj);
        }
        else {
          dVar8 = QPDFObjectHandle::getNumericValue(&h_obj);
          local_11c = (uint)(long)dVar8;
        }
        bVar4 = QPDFObjectHandle::isName(&colorspace_obj);
        if (bVar4) {
          QPDFObjectHandle::getName_abi_cxx11_(&colorspace,&colorspace_obj);
        }
        else {
          colorspace._M_string_length = 0;
          colorspace.field_2._M_local_buf[0] = '\0';
          colorspace._M_dataplus._M_p = (pointer)paVar1;
        }
        components = 0;
        cs = JCS_UNKNOWN;
        iVar5 = std::__cxx11::string::compare((char *)&colorspace);
        if (iVar5 == 0) {
          components = 3;
          cs = JCS_RGB;
          _Var7._M_pi = extraout_RDX_05;
LAB_00187a46:
          uVar2 = *(ulong *)((long)&description->field_2 + 8);
          _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        CONCAT71((int7)((ulong)_Var7._M_pi >> 8),uVar2 == 0);
          if (uVar2 < local_118 || uVar2 == 0) {
            pcVar3 = description[1]._M_dataplus._M_p;
            _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          CONCAT71((int7)((ulong)pcVar3 >> 8),
                                   pcVar3 < (pointer)(ulong)local_11c || pcVar3 == (pointer)0x0);
            if ((pcVar3 < (pointer)(ulong)local_11c || pcVar3 == (pointer)0x0) &&
               ((_Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               description[1]._M_string_length,
                _Var7._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
                (_Var7._M_pi <
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(local_11c * local_118)))))
            {
              local_28 = (CompressConfig *)description[2]._M_string_length;
              local_b8 = (Pl_DCT *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<Pl_DCT,std::allocator<Pl_DCT>,char_const(&)[4],Pipeline*&,unsigned_int&,unsigned_int&,int&,J_COLOR_SPACE&,Pl_DCT::CompressConfig*>
                        (&_Stack_b0,&local_b8,(allocator<Pl_DCT> *)&local_111,(char (*) [4])"jpg",
                         &next_local,&local_118,&local_11c,&components,&cs,&local_28);
              _Var9._M_refcount._M_pi = extraout_RDX_09._M_pi;
              _Var9._M_ptr = extraout_RAX;
              (this->super_StreamDataProvider)._vptr_StreamDataProvider = (_func_int **)local_b8;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               &(this->super_StreamDataProvider).supports_retry = _Stack_b0._M_pi;
              goto LAB_00187b5b;
            }
          }
          _Var9._M_refcount._M_pi = _Var7._M_pi;
          _Var9._M_ptr = (element_type *)(ulong)local_118;
          if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
            local_a8._8_8_ = 0;
            local_90 = std::
                       _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:199:27)>
                       ::_M_invoke;
            local_98 = (element_type *)
                       std::
                       _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:199:27)>
                       ::_M_manager;
            local_a8._M_unused._M_object = next;
            QPDFJob::doIfVerbose
                      ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                       (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_a8);
            _Var9._M_refcount._M_pi = extraout_RDX_08._M_pi;
            _Var9._M_ptr = local_98;
            if (local_98 != (element_type *)0x0) {
              _Var9 = (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)
                      (*(code *)local_98)(&local_a8,&local_a8,3);
            }
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&colorspace);
          if (iVar5 == 0) {
            cs = JCS_GRAYSCALE;
            _Var7._M_pi = extraout_RDX_06;
            components = cs;
            goto LAB_00187a46;
          }
          _Var9 = (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)
                  std::__cxx11::string::compare((char *)&colorspace);
          _Var7 = _Var9._M_refcount._M_pi;
          if ((int)_Var9._M_ptr == 0) {
            cs = JCS_CMYK;
            components = cs;
            goto LAB_00187a46;
          }
          if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
            local_88._8_8_ = 0;
            local_70 = std::
                       _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:187:27)>
                       ::_M_invoke;
            local_78 = (element_type *)
                       std::
                       _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:187:27)>
                       ::_M_manager;
            local_88._M_unused._M_object = next;
            QPDFJob::doIfVerbose
                      ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                       (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_88);
            _Var9._M_refcount._M_pi = extraout_RDX_07._M_pi;
            _Var9._M_ptr = local_78;
            if (local_78 != (element_type *)0x0) {
              _Var9 = (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)
                      (*(code *)local_78)(&local_88,&local_88,3);
            }
          }
        }
LAB_00187b5b:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)colorspace._M_dataplus._M_p != paVar1) {
          operator_delete(colorspace._M_dataplus._M_p,
                          CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                                   colorspace.field_2._M_local_buf[0]) + 1);
          _Var9._M_refcount._M_pi = extraout_RDX_10._M_pi;
          _Var9._M_ptr = extraout_RAX_00;
        }
      }
      else {
        _Var9._M_refcount._M_pi = _Var7._M_pi;
        _Var9._M_ptr = peVar6;
        if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
          local_68._8_8_ = 0;
          local_50 = std::
                     _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:151:27)>
                     ::_M_invoke;
          local_58 = (element_type *)
                     std::
                     _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:151:27)>
                     ::_M_manager;
          local_68._M_unused._M_object = next;
          QPDFJob::doIfVerbose
                    ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                     (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_68);
          _Var9._M_refcount._M_pi = extraout_RDX_04._M_pi;
          _Var9._M_ptr = local_58;
          if (local_58 != (element_type *)0x0) {
            _Var9 = (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)
                    (*(code *)local_58)(&local_68,&local_68,3);
          }
        }
      }
      if (components_obj.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (components_obj.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        _Var9._M_refcount._M_pi = extraout_RDX_11._M_pi;
        _Var9._M_ptr = extraout_RAX_01;
      }
      goto LAB_00187b81;
    }
  }
  _Var9._M_refcount._M_pi = _Var7._M_pi;
  _Var9._M_ptr = peVar6;
  if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:140:27)>
               ::_M_invoke;
    local_38 = (element_type *)
               std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:140:27)>
               ::_M_manager;
    local_48._M_unused._M_object = next;
    QPDFJob::doIfVerbose
              ((QPDFJob *)(description->field_2)._M_allocated_capacity,
               (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_48);
    _Var9._M_refcount._M_pi = extraout_RDX_03._M_pi;
    _Var9._M_ptr = local_38;
    if (local_38 != (element_type *)0x0) {
      _Var9 = (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)
              (*(code *)local_38)(&local_48,&local_48,3);
    }
  }
LAB_00187b81:
  if (colorspace_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (colorspace_obj.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var9._M_refcount._M_pi = extraout_RDX_12._M_pi;
    _Var9._M_ptr = extraout_RAX_02;
  }
  if (h_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (h_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var9._M_refcount._M_pi = extraout_RDX_13._M_pi;
    _Var9._M_ptr = extraout_RAX_03;
  }
  if (w_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (w_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var9._M_refcount._M_pi = extraout_RDX_14._M_pi;
    _Var9._M_ptr = extraout_RAX_04;
  }
  if (dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var9._M_refcount._M_pi = extraout_RDX_15._M_pi;
    _Var9._M_ptr = extraout_RAX_05;
  }
  return (shared_ptr<Pipeline>)_Var9;
}

Assistant:

std::shared_ptr<Pipeline>
ImageOptimizer::makePipeline(std::string const& description, Pipeline* next)
{
    std::shared_ptr<Pipeline> result;
    QPDFObjectHandle dict = image.getDict();
    QPDFObjectHandle w_obj = dict.getKey("/Width");
    QPDFObjectHandle h_obj = dict.getKey("/Height");
    QPDFObjectHandle colorspace_obj = dict.getKey("/ColorSpace");
    if (!(w_obj.isNumber() && h_obj.isNumber())) {
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image dictionary is missing required keys\n";
            });
        }
        return result;
    }
    QPDFObjectHandle components_obj = dict.getKey("/BitsPerComponent");
    if (!(components_obj.isInteger() && (components_obj.getIntValue() == 8))) {
        QTC::TC("qpdf", "QPDFJob image optimize bits per component");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image has other than 8 bits per component\n";
            });
        }
        return result;
    }
    // Files have been seen in the wild whose width and height are floating point, which is goofy,
    // but we can deal with it.
    JDIMENSION w = 0;
    if (w_obj.isInteger()) {
        w = w_obj.getUIntValueAsUInt();
    } else {
        w = static_cast<JDIMENSION>(w_obj.getNumericValue());
    }
    JDIMENSION h = 0;
    if (h_obj.isInteger()) {
        h = h_obj.getUIntValueAsUInt();
    } else {
        h = static_cast<JDIMENSION>(h_obj.getNumericValue());
    }
    std::string colorspace = (colorspace_obj.isName() ? colorspace_obj.getName() : std::string());
    int components = 0;
    J_COLOR_SPACE cs = JCS_UNKNOWN;
    if (colorspace == "/DeviceRGB") {
        components = 3;
        cs = JCS_RGB;
    } else if (colorspace == "/DeviceGray") {
        components = 1;
        cs = JCS_GRAYSCALE;
    } else if (colorspace == "/DeviceCMYK") {
        components = 4;
        cs = JCS_CMYK;
    } else {
        QTC::TC("qpdf", "QPDFJob image optimize colorspace");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because qpdf can't optimize images with this colorspace\n";
            });
        }
        return result;
    }
    if (((this->oi_min_width > 0) && (w <= this->oi_min_width)) ||
        ((this->oi_min_height > 0) && (h <= this->oi_min_height)) ||
        ((this->oi_min_area > 0) && ((w * h) <= this->oi_min_area))) {
        QTC::TC("qpdf", "QPDFJob image optimize too small");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image is smaller than requested minimum "
                     "dimensions\n";
            });
        }
        return result;
    }

    result = std::make_shared<Pl_DCT>("jpg", next, w, h, components, cs, config.get());
    return result;
}